

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

Error __thiscall llvm::sys::fs::TempFile::keep(TempFile *this,Twine *Name)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  error_category *__cat;
  error_category *in_RDX;
  undefined8 extraout_RDX;
  size_t extraout_RDX_00;
  StringRef Filename;
  error_code eVar4;
  error_code EC_00;
  int local_e8;
  undefined1 local_c8 [8];
  error_code EC;
  char *local_b0;
  Twine local_98;
  Twine local_80;
  int local_68;
  undefined4 uStack_64;
  error_category *local_60;
  Twine local_58;
  undefined1 local_40 [8];
  error_code RenameEC;
  Twine *Name_local;
  TempFile *this_local;
  
  if ((((Name->LHS).character ^ 0xffU) & 1) != 0) {
    (Name->LHS).character = '\x01';
    RenameEC._M_cat = in_RDX;
    Twine::Twine(&local_58,(string *)&Name->RHS);
    local_40._0_4_ = rename((char *)&local_58,(char *)RenameEC._M_cat);
    RenameEC._0_8_ = extraout_RDX;
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_40);
    if (bVar1) {
      Twine::Twine(&local_80,(string *)&Name->RHS);
      eVar4 = copy_file(&local_80,(Twine *)RenameEC._M_cat);
      local_60 = eVar4._M_cat;
      local_68 = eVar4._M_value;
      local_40._4_4_ = uStack_64;
      local_40._0_4_ = local_68;
      RenameEC._0_8_ = local_60;
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_40);
      if (bVar1) {
        Twine::Twine(&local_98,(string *)&Name->RHS);
        remove((fs *)&local_98,(char *)0x1);
      }
    }
    EC._M_cat = (error_category *)std::__cxx11::string::data();
    std::__cxx11::string::length();
    Filename.Length = extraout_RDX_00;
    Filename.Data = local_b0;
    DontRemoveFileOnSignal((sys *)EC._M_cat,Filename);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_40);
    if (!bVar1) {
      std::__cxx11::string::operator=((string *)&(Name->RHS).character,"");
    }
    iVar2._0_1_ = Name[1].LHSKind;
    iVar2._1_1_ = Name[1].RHSKind;
    iVar2._2_2_ = *(undefined2 *)&Name[1].field_0x12;
    iVar2 = close(iVar2);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      iVar2 = *piVar3;
      __cat = (error_category *)std::_V2::generic_category();
      std::error_code::error_code((error_code *)local_c8,iVar2,__cat);
      EC_00._M_cat._0_4_ = local_c8._0_4_;
      EC_00._0_8_ = this;
      EC_00._M_cat._4_4_ = 0;
      errorCodeToError(EC_00);
    }
    else {
      Name[1].LHSKind = ~NullKind;
      Name[1].RHSKind = ~NullKind;
      *(undefined2 *)&Name[1].field_0x12 = 0xffff;
      local_e8 = local_40._0_4_;
      eVar4._M_cat._0_4_ = local_e8;
      eVar4._0_8_ = this;
      eVar4._M_cat._4_4_ = 0;
      errorCodeToError(eVar4);
    }
    return (Error)(ErrorInfoBase *)this;
  }
  __assert_fail("!Done",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Path.cpp"
                ,0x47a,"Error llvm::sys::fs::TempFile::keep(const Twine &)");
}

Assistant:

Error TempFile::keep(const Twine &Name) {
  assert(!Done);
  Done = true;
  // Always try to close and rename.
#ifdef _WIN32
  // If we can't cancel the delete don't rename.
  auto H = reinterpret_cast<HANDLE>(_get_osfhandle(FD));
  std::error_code RenameEC = setDeleteDisposition(H, false);
  if (!RenameEC)
    RenameEC = rename_fd(FD, Name);
  // If we can't rename, discard the temporary file.
  if (RenameEC)
    setDeleteDisposition(H, true);
#else
  std::error_code RenameEC = fs::rename(TmpName, Name);
  if (RenameEC) {
    // If we can't rename, try to copy to work around cross-device link issues.
    RenameEC = sys::fs::copy_file(TmpName, Name);
    // If we can't rename or copy, discard the temporary file.
    if (RenameEC)
      remove(TmpName);
  }
  sys::DontRemoveFileOnSignal(TmpName);
#endif

  if (!RenameEC)
    TmpName = "";

  if (close(FD) == -1) {
    std::error_code EC(errno, std::generic_category());
    return errorCodeToError(EC);
  }
  FD = -1;

  return errorCodeToError(RenameEC);
}